

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoapyRateTest.cpp
# Opt level: O2

int SoapySDRRateTest(string *argStr,double sampleRate,string *formatStr,string *channelStr,
                    string *directionStr)

{
  _Rb_tree_node_base *p_Var1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  Device *device;
  _Rb_tree_node_base *p_Var5;
  size_t elemSize;
  Stream *stream;
  ostream *poVar6;
  invalid_argument *this;
  int direction;
  unsigned_long *chan;
  pointer puVar7;
  pointer puVar8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> channels;
  string format;
  double fullScale;
  undefined1 local_68 [32];
  _Rb_tree_node_base *local_48;
  size_t local_40;
  
  device = (Device *)SoapySDR::Device::make((string *)argStr);
  bVar2 = std::operator==(directionStr,"RX");
  if (!bVar2) {
    bVar2 = std::operator==(directionStr,"rx");
    if (!bVar2) {
      iVar4 = -1;
      bVar2 = false;
      goto LAB_001099dd;
    }
  }
  iVar4 = 1;
  bVar2 = true;
LAB_001099dd:
  bVar3 = std::operator==(directionStr,"TX");
  direction = 0;
  if (!bVar3) {
    bVar3 = std::operator==(directionStr,"tx");
    direction = iVar4;
    if (bVar3) {
      direction = 0;
    }
    if (!bVar2 && !bVar3) {
      this = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68,
                     "direction not in RX/TX: ",directionStr);
      std::invalid_argument::invalid_argument(this,(string *)local_68);
      __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
    }
  }
  channels.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  channels.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  channels.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  SoapySDR::KwargsFromString((string *)local_68);
  p_Var1 = (_Rb_tree_node_base *)(local_68 + 8);
  for (p_Var5 = (_Rb_tree_node_base *)local_68._24_8_; p_Var5 != p_Var1;
      p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5)) {
    iVar4 = std::__cxx11::stoi((string *)(p_Var5 + 1),(size_t *)0x0,10);
    format._M_dataplus._M_p = (pointer)(long)iVar4;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
              (&channels,(unsigned_long *)&format);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)local_68);
  puVar7 = channels.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar8 = channels.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (channels.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start ==
      channels.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    local_68._0_8_ = (pointer)0x0;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
              (&channels,(unsigned_long *)local_68);
    puVar7 = channels.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
    puVar8 = channels.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish;
  }
  for (; puVar7 != puVar8; puVar7 = puVar7 + 1) {
    (**(code **)(*(long *)device + 0x1f8))(sampleRate,device,direction,*puVar7);
  }
  fullScale = 0.0;
  if (formatStr->_M_string_length == 0) {
    (**(code **)(*(long *)device + 0x58))
              (&format,device,direction,
               *channels.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start,&fullScale);
  }
  else {
    std::__cxx11::string::string((string *)&format,(string *)formatStr);
  }
  elemSize = SoapySDR::formatToSize((string *)&format);
  local_68._16_8_ = (_Base_ptr)0x0;
  local_68._0_8_ = (pointer)0x0;
  local_68._8_8_ = 0;
  local_40 = 0;
  local_68._24_8_ = p_Var1;
  local_48 = p_Var1;
  stream = (Stream *)(**(code **)(*(long *)device + 0x68))(device,direction,&format,&channels);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)local_68);
  poVar6 = std::operator<<((ostream *)&std::cout,"Stream format: ");
  poVar6 = std::operator<<(poVar6,(string *)&format);
  std::endl<char,std::char_traits<char>>(poVar6);
  poVar6 = std::operator<<((ostream *)&std::cout,"Num channels: ");
  poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
  std::endl<char,std::char_traits<char>>(poVar6);
  poVar6 = std::operator<<((ostream *)&std::cout,"Element size: ");
  poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
  poVar6 = std::operator<<(poVar6," bytes");
  std::endl<char,std::char_traits<char>>(poVar6);
  poVar6 = std::operator<<((ostream *)&std::cout,"Begin ");
  poVar6 = std::operator<<(poVar6,(string *)directionStr);
  std::operator<<(poVar6," rate test at ");
  poVar6 = std::ostream::_M_insert<double>(sampleRate / 1000000.0);
  poVar6 = std::operator<<(poVar6," Msps");
  std::endl<char,std::char_traits<char>>(poVar6);
  runRateTestStreamLoop
            (device,stream,direction,
             (long)channels.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)channels.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_start >> 3,elemSize);
  (**(code **)(*(long *)device + 0x70))(device,stream);
  SoapySDR::Device::unmake(device);
  std::__cxx11::string::~string((string *)&format);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&channels.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  return 1;
}

Assistant:

int SoapySDRRateTest(
    const std::string &argStr,
    const double sampleRate,
    const std::string &formatStr,
    const std::string &channelStr,
    const std::string &directionStr)
{
    SoapySDR::Device *device(nullptr);

    try
    {
        device = SoapySDR::Device::make(argStr);

        //parse the direction to the integer enum
        int direction(-1);
        if (directionStr == "RX" or directionStr == "rx") direction = SOAPY_SDR_RX;
        if (directionStr == "TX" or directionStr == "tx") direction = SOAPY_SDR_TX;
        if (direction == -1) throw std::invalid_argument("direction not in RX/TX: " + directionStr);

        //build channels list, using KwargsFromString is a easy parsing hack
        std::vector<size_t> channels;
        for (const auto &pair : SoapySDR::KwargsFromString(channelStr))
        {
            channels.push_back(std::stoi(pair.first));
        }
        if (channels.empty()) channels.push_back(0);

        //initialize the sample rate for all channels
        for (const auto &chan : channels)
        {
            device->setSampleRate(direction, chan, sampleRate);
        }

        //create the stream, use the native format
        double fullScale(0.0);
        const auto format = formatStr.empty() ? device->getNativeStreamFormat(direction, channels.front(), fullScale) : formatStr;
        const size_t elemSize = SoapySDR::formatToSize(format);
        auto stream = device->setupStream(direction, format, channels);

        //run the rate test one setup is complete
        std::cout << "Stream format: " << format << std::endl;
        std::cout << "Num channels: " << channels.size() << std::endl;
        std::cout << "Element size: " << elemSize << " bytes" << std::endl;
        std::cout << "Begin " << directionStr << " rate test at " << (sampleRate/1e6) << " Msps" << std::endl;
        runRateTestStreamLoop(device, stream, direction, channels.size(), elemSize);

        //cleanup stream and device
        device->closeStream(stream);
        SoapySDR::Device::unmake(device);
    }
    catch (const std::exception &ex)
    {
        std::cerr << "Error in rate test: " << ex.what() << std::endl;
        SoapySDR::Device::unmake(device);
        return EXIT_FAILURE;
    }
    return EXIT_FAILURE;
}